

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

void __thiscall
ddd::DaTrie<false,_false,_false>::shelter_
          (DaTrie<false,_false,_false> *this,uint32_t base,Edge *edge,Query *query)

{
  size_t sVar1;
  Bc BVar2;
  uint32_t base_00;
  size_t sVar3;
  Edge *__range2;
  uint node_pos;
  Edge local_138;
  
  memset(&local_138,0,0x108);
  sVar1 = edge->size_;
  if (sVar1 != 0) {
    sVar3 = 0;
    do {
      BVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
              super__Vector_impl_data._M_start[edge->labels_[sVar3] ^ base];
      if ((long)BVar2 < 0) {
        node_pos = BVar2._4_4_ & 0x7fffffff;
        edge_(this,node_pos,&local_138,0x100);
        base_00 = xcheck_(this,&local_138,base >> 8,&this->blocks_);
        move_(this,node_pos,base_00,&local_138,query);
      }
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  return;
}

Assistant:

void shelter_(uint32_t base, const Edge& edge, Query& query) {
    Edge _edge;
    auto ng_block = base / BLOCK_SIZE;

    for (auto label : edge) {
      auto child_pos = base ^label;
      if (bc_[child_pos].is_fixed()) {
        auto node_pos = bc_[child_pos].check();
        edge_(node_pos, _edge);

        auto _base = xcheck_(_edge, ng_block, blocks_);
        move_(node_pos, _base, _edge, query);
      }
    }
  }